

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O0

int Gia_ManSatEnum(Gia_Man_t *pGia,int nConfLimit,int nTimeOut,int fVerbose)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Cnf_Dat_t *p;
  sat_solver *s;
  Vec_Int_t *p_00;
  int *begin;
  int *piVar4;
  abctime aVar5;
  int status;
  abctime clkStart;
  int RetValue;
  int nSolutions;
  int Iter;
  int iParVarBeg;
  int iLit;
  int i;
  Vec_Int_t *vLits;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  int fVerbose_local;
  int nTimeOut_local;
  int nConfLimit_local;
  Gia_Man_t *pGia_local;
  
  clkStart._4_4_ = 0;
  aVar3 = Abc_Clock();
  p = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,1,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
  iVar2 = p->nVars;
  iVar1 = Gia_ManPiNum(pGia);
  iVar2 = iVar2 - iVar1;
  Cnf_DataFree(p);
  iVar1 = Gia_ManPiNum(pGia);
  p_00 = Vec_IntAlloc(iVar1);
  RetValue = 1;
  do {
    iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)nConfLimit,0,0,0);
    if (iVar1 == -1) {
      clkStart._0_4_ = 1;
LAB_009c29e1:
      sat_solver_delete(s);
      Vec_IntFree(p_00);
      if ((nTimeOut == 0) || (aVar5 = Abc_Clock(), (aVar5 - aVar3) / 1000000 < (long)nTimeOut)) {
        if ((nConfLimit == 0) || ((int)clkStart != 0)) {
          printf("Enumerated the complete set of %d assignments.  ",(ulong)clkStart._4_4_);
        }
        else {
          printf("Enumerated %d assignments when conflict limit (%d) was reached.  ",
                 (ulong)clkStart._4_4_,(ulong)(uint)nConfLimit);
        }
      }
      else {
        printf("Enumerated %d assignments when timeout (%d sec) was reached.  ",
               (ulong)clkStart._4_4_,(ulong)(uint)nTimeOut);
      }
      aVar5 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar5 - aVar3);
      return (int)clkStart;
    }
    if (iVar1 == 0) {
      clkStart._0_4_ = 0;
      goto LAB_009c29e1;
    }
    clkStart._4_4_ = clkStart._4_4_ + 1;
    Vec_IntClear(p_00);
    for (iParVarBeg = 0; iVar1 = Gia_ManPiNum(pGia), iParVarBeg < iVar1; iParVarBeg = iParVarBeg + 1
        ) {
      iVar1 = sat_solver_var_value(s,iVar2 + iParVarBeg);
      iVar1 = Abc_Var2Lit(iVar2 + iParVarBeg,iVar1);
      Vec_IntPush(p_00,iVar1);
    }
    if (fVerbose != 0) {
      printf("%5d : ",(ulong)(uint)RetValue);
      for (iParVarBeg = 0; iVar1 = Vec_IntSize(p_00), iParVarBeg < iVar1;
          iParVarBeg = iParVarBeg + 1) {
        iVar1 = Vec_IntEntry(p_00,iParVarBeg);
        iVar1 = Abc_LitIsCompl(iVar1);
        printf("%d",(ulong)((iVar1 != 0 ^ 0xffU) & 1));
      }
      printf("\n");
    }
    begin = Vec_IntArray(p_00);
    piVar4 = Vec_IntArray(p_00);
    iVar1 = Vec_IntSize(p_00);
    iVar1 = sat_solver_addclause(s,begin,piVar4 + iVar1);
    if (iVar1 == 0) {
      clkStart._0_4_ = 1;
      goto LAB_009c29e1;
    }
    if ((nTimeOut != 0) && (aVar5 = Abc_Clock(), (long)nTimeOut <= (aVar5 - aVar3) / 1000000)) {
      clkStart._0_4_ = 0;
      goto LAB_009c29e1;
    }
    RetValue = RetValue + 1;
  } while( true );
}

Assistant:

int Gia_ManSatEnum( Gia_Man_t * pGia, int nConfLimit, int nTimeOut, int fVerbose )
{
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Vec_Int_t * vLits;
    int i, iLit, iParVarBeg, Iter;
    int nSolutions = 0, RetValue = 0;
    abctime clkStart = Abc_Clock();
    pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 1, 0, 0 );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    iParVarBeg = pCnf->nVars - Gia_ManPiNum(pGia);// - 1;
    Cnf_DataFree( pCnf );
    // iterate through the SAT assignment
    vLits = Vec_IntAlloc( Gia_ManPiNum(pGia) );
    for ( Iter = 1 ; ; Iter++ )
    {
        int status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, 0, 0, 0 );
        if ( status == l_False ) { RetValue =  1; break; }
        if ( status == l_Undef ) { RetValue =  0; break; }
        nSolutions++;
        // extract SAT assignment
        Vec_IntClear( vLits );
        for ( i = 0; i < Gia_ManPiNum(pGia); i++ )
            Vec_IntPush( vLits, Abc_Var2Lit(iParVarBeg+i, sat_solver_var_value(pSat, iParVarBeg+i)) );
        if ( fVerbose )
        {
            printf( "%5d : ", Iter );
            Vec_IntForEachEntry( vLits, iLit, i )
                printf( "%d", !Abc_LitIsCompl(iLit) );
            printf( "\n" );
        }
        // add clause
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) ) )
            { RetValue =  1; break; }
        if ( nTimeOut && (Abc_Clock() - clkStart)/CLOCKS_PER_SEC >= nTimeOut ) { RetValue = 0; break; }
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vLits );
    if ( nTimeOut && (Abc_Clock() - clkStart)/CLOCKS_PER_SEC >= nTimeOut )
        printf( "Enumerated %d assignments when timeout (%d sec) was reached.  ", nSolutions, nTimeOut );
    else if ( nConfLimit && !RetValue )
        printf( "Enumerated %d assignments when conflict limit (%d) was reached.  ", nSolutions, nConfLimit );
    else 
        printf( "Enumerated the complete set of %d assignments.  ", nSolutions );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    return RetValue;
}